

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_wav_post_init(ma_wav *pWav)

{
  ma_uint16 mVar1;
  ma_result in_EAX;
  ma_format mVar2;
  ushort uVar3;
  
  if (pWav->format != ma_format_unknown) {
    return in_EAX;
  }
  mVar2 = ma_format_f32;
  if (((pWav->dr).translatedFormatTag == 1) &&
     (mVar1 = (pWav->dr).bitsPerSample, uVar3 = mVar1 << 0xd | (ushort)(mVar1 - 8) >> 3, uVar3 < 4))
  {
    mVar2 = (ma_format)(ushort)(uVar3 + 1);
  }
  pWav->format = mVar2;
  return mVar2;
}

Assistant:

static ma_result ma_wav_post_init(ma_wav* pWav)
{
    /*
    If an explicit format was not specified, try picking the closest match based on the internal
    format. The format needs to be supported by miniaudio.
    */
    if (pWav->format == ma_format_unknown) {
        switch (pWav->dr.translatedFormatTag)
        {
            case MA_DR_WAVE_FORMAT_PCM:
            {
                if (pWav->dr.bitsPerSample == 8) {
                    pWav->format = ma_format_u8;
                } else if (pWav->dr.bitsPerSample == 16) {
                    pWav->format = ma_format_s16;
                } else if (pWav->dr.bitsPerSample == 24) {
                    pWav->format = ma_format_s24;
                } else if (pWav->dr.bitsPerSample == 32) {
                    pWav->format = ma_format_s32;
                }
            } break;

            case MA_DR_WAVE_FORMAT_IEEE_FLOAT:
            {
                if (pWav->dr.bitsPerSample == 32) {
                    pWav->format = ma_format_f32;
                }
            } break;

            default: break;
        }

        /* Fall back to f32 if we couldn't find anything. */
        if (pWav->format == ma_format_unknown) {
            pWav->format =  ma_format_f32;
        }
    }

    return MA_SUCCESS;
}